

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_sha1_perform_all_rounds(fio_sha1_s *s,uint8_t *buffer)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint32_t w [16];
  uint32_t t;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint8_t *buffer_local;
  fio_sha1_s *s_local;
  
  uVar20 = (s->digest).i[0];
  uVar18 = (s->digest).i[1];
  uVar21 = (s->digest).i[2];
  uVar1 = (uint)*buffer << 0x18 | (uint)buffer[1] << 0x10 | (uint)buffer[2] << 8 | (uint)buffer[3];
  uVar2 = (uint)buffer[4] << 0x18 | (uint)buffer[5] << 0x10 | (uint)buffer[6] << 8 | (uint)buffer[7]
  ;
  uVar3 = (uint)buffer[8] << 0x18 | (uint)buffer[9] << 0x10 | (uint)buffer[10] << 8 |
          (uint)buffer[0xb];
  uVar4 = (uint)buffer[0xc] << 0x18 | (uint)buffer[0xd] << 0x10 | (uint)buffer[0xe] << 8 |
          (uint)buffer[0xf];
  uVar5 = (uint)buffer[0x10] << 0x18 | (uint)buffer[0x11] << 0x10 | (uint)buffer[0x12] << 8 |
          (uint)buffer[0x13];
  uVar6 = (uint)buffer[0x14] << 0x18 | (uint)buffer[0x15] << 0x10 | (uint)buffer[0x16] << 8 |
          (uint)buffer[0x17];
  uVar7 = (uint)buffer[0x18] << 0x18 | (uint)buffer[0x19] << 0x10 | (uint)buffer[0x1a] << 8 |
          (uint)buffer[0x1b];
  uVar8 = (uint)buffer[0x1c] << 0x18 | (uint)buffer[0x1d] << 0x10 | (uint)buffer[0x1e] << 8 |
          (uint)buffer[0x1f];
  uVar9 = (uint)buffer[0x20] << 0x18 | (uint)buffer[0x21] << 0x10 | (uint)buffer[0x22] << 8 |
          (uint)buffer[0x23];
  uVar10 = (uint)buffer[0x24] << 0x18 | (uint)buffer[0x25] << 0x10 | (uint)buffer[0x26] << 8 |
           (uint)buffer[0x27];
  uVar11 = (uint)buffer[0x28] << 0x18 | (uint)buffer[0x29] << 0x10 | (uint)buffer[0x2a] << 8 |
           (uint)buffer[0x2b];
  uVar12 = (uint)buffer[0x2c] << 0x18 | (uint)buffer[0x2d] << 0x10 | (uint)buffer[0x2e] << 8 |
           (uint)buffer[0x2f];
  uVar13 = (uint)buffer[0x30] << 0x18 | (uint)buffer[0x31] << 0x10 | (uint)buffer[0x32] << 8 |
           (uint)buffer[0x33];
  uVar14 = (uint)buffer[0x34] << 0x18 | (uint)buffer[0x35] << 0x10 | (uint)buffer[0x36] << 8 |
           (uint)buffer[0x37];
  uVar15 = (uint)buffer[0x38] << 0x18 | (uint)buffer[0x39] << 0x10 | (uint)buffer[0x3a] << 8 |
           (uint)buffer[0x3b];
  uVar16 = (uint)buffer[0x3c] << 0x18 | (uint)buffer[0x3d] << 0x10 | (uint)buffer[0x3e] << 8 |
           (uint)buffer[0x3f];
  uVar17 = (uVar20 << 5 | uVar20 >> 0x1b) + (s->digest).i[4] + uVar1 +
           (uVar18 & uVar21 | (uVar18 ^ 0xffffffff) & (s->digest).i[3]) + 0x5a827999;
  uVar18 = uVar18 << 0x1e | uVar18 >> 2;
  uVar19 = (uVar17 * 0x20 | uVar17 >> 0x1b) + (s->digest).i[3] + uVar2 +
           (uVar20 & uVar18 | (uVar20 ^ 0xffffffff) & uVar21) + 0x5a827999;
  uVar20 = uVar20 << 0x1e | uVar20 >> 2;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar21 + uVar3 +
           (uVar17 & uVar20 | (uVar17 ^ 0xffffffff) & uVar18) + 0x5a827999;
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar18 + uVar4 +
           (uVar19 & uVar17 | (uVar19 ^ 0xffffffff) & uVar20) + 0x5a827999;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + uVar20 + uVar5 +
           (uVar21 & uVar19 | (uVar21 ^ 0xffffffff) & uVar17) + 0x5a827999;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar17 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar17 + uVar6 +
           (uVar18 & uVar21 | (uVar18 ^ 0xffffffff) & uVar19) + 0x5a827999;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar19 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar19 + uVar7 +
           (uVar20 & uVar18 | (uVar20 ^ 0xffffffff) & uVar21) + 0x5a827999;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar21 + uVar8 +
           (uVar17 & uVar20 | (uVar17 ^ 0xffffffff) & uVar18) + 0x5a827999;
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar18 + uVar9 +
           (uVar19 & uVar17 | (uVar19 ^ 0xffffffff) & uVar20) + 0x5a827999;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + uVar20 + uVar10 +
           (uVar21 & uVar19 | (uVar21 ^ 0xffffffff) & uVar17) + 0x5a827999;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar17 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar17 + uVar11 +
           (uVar18 & uVar21 | (uVar18 ^ 0xffffffff) & uVar19) + 0x5a827999;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar19 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar19 + uVar12 +
           (uVar20 & uVar18 | (uVar20 ^ 0xffffffff) & uVar21) + 0x5a827999;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar21 + uVar13 +
           (uVar17 & uVar20 | (uVar17 ^ 0xffffffff) & uVar18) + 0x5a827999;
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar18 + uVar14 +
           (uVar19 & uVar17 | (uVar19 ^ 0xffffffff) & uVar20) + 0x5a827999;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + uVar20 + uVar15 +
           (uVar21 & uVar19 | (uVar21 ^ 0xffffffff) & uVar17) + 0x5a827999;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar17 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar17 + uVar16 +
           (uVar18 & uVar21 | (uVar18 ^ 0xffffffff) & uVar19) + 0x5a827999;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar1 = (uVar14 ^ uVar9 ^ uVar3 ^ uVar1) << 1 | (uVar14 ^ uVar9 ^ uVar3 ^ uVar1) >> 0x1f;
  uVar19 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar19 + uVar1 +
           (uVar20 & uVar18 | (uVar20 ^ 0xffffffff) & uVar21) + 0x5a827999;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar2 = (uVar15 ^ uVar10 ^ uVar4 ^ uVar2) << 1 | (uVar15 ^ uVar10 ^ uVar4 ^ uVar2) >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar21 + uVar2 +
           (uVar17 & uVar20 | (uVar17 ^ 0xffffffff) & uVar18) + 0x5a827999;
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar3 = (uVar16 ^ uVar11 ^ uVar5 ^ uVar3) << 1 | (uVar16 ^ uVar11 ^ uVar5 ^ uVar3) >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar18 + uVar3 +
           (uVar19 & uVar17 | (uVar19 ^ 0xffffffff) & uVar20) + 0x5a827999;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar4 = (uVar1 ^ uVar12 ^ uVar6 ^ uVar4) << 1 | (uVar1 ^ uVar12 ^ uVar6 ^ uVar4) >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + uVar20 + uVar4 +
           (uVar21 & uVar19 | (uVar21 ^ 0xffffffff) & uVar17) + 0x5a827999;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar5 = (uVar2 ^ uVar13 ^ uVar7 ^ uVar5) << 1 | (uVar2 ^ uVar13 ^ uVar7 ^ uVar5) >> 0x1f;
  uVar17 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar17 + uVar5 + (uVar18 ^ uVar21 ^ uVar19) +
           0x6ed9eba1;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar6 = (uVar3 ^ uVar14 ^ uVar8 ^ uVar6) << 1 | (uVar3 ^ uVar14 ^ uVar8 ^ uVar6) >> 0x1f;
  uVar19 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar19 + uVar6 + (uVar20 ^ uVar18 ^ uVar21) +
           0x6ed9eba1;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar7 = (uVar4 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar4 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar21 + uVar7 + (uVar17 ^ uVar20 ^ uVar18) +
           0x6ed9eba1;
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar8 = (uVar5 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar5 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar18 + uVar8 + (uVar19 ^ uVar17 ^ uVar20) +
           0x6ed9eba1;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar9 = (uVar6 ^ uVar1 ^ uVar11 ^ uVar9) << 1 | (uVar6 ^ uVar1 ^ uVar11 ^ uVar9) >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + uVar20 + uVar9 + (uVar21 ^ uVar19 ^ uVar17) +
           0x6ed9eba1;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar10 = (uVar7 ^ uVar2 ^ uVar12 ^ uVar10) << 1 | (uVar7 ^ uVar2 ^ uVar12 ^ uVar10) >> 0x1f;
  uVar17 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar17 + uVar10 + (uVar18 ^ uVar21 ^ uVar19) +
           0x6ed9eba1;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar11 = (uVar8 ^ uVar3 ^ uVar13 ^ uVar11) << 1 | (uVar8 ^ uVar3 ^ uVar13 ^ uVar11) >> 0x1f;
  uVar19 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar19 + uVar11 + (uVar20 ^ uVar18 ^ uVar21) +
           0x6ed9eba1;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar12 = (uVar9 ^ uVar4 ^ uVar14 ^ uVar12) << 1 | (uVar9 ^ uVar4 ^ uVar14 ^ uVar12) >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar21 + uVar12 + (uVar17 ^ uVar20 ^ uVar18) +
           0x6ed9eba1;
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar13 = (uVar10 ^ uVar5 ^ uVar15 ^ uVar13) << 1 | (uVar10 ^ uVar5 ^ uVar15 ^ uVar13) >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar18 + uVar13 + (uVar19 ^ uVar17 ^ uVar20) +
           0x6ed9eba1;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar14 = (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) << 1 | (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + uVar20 + uVar14 + (uVar21 ^ uVar19 ^ uVar17) +
           0x6ed9eba1;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar15 = (uVar12 ^ uVar7 ^ uVar1 ^ uVar15) << 1 | (uVar12 ^ uVar7 ^ uVar1 ^ uVar15) >> 0x1f;
  uVar17 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar17 + uVar15 + (uVar18 ^ uVar21 ^ uVar19) +
           0x6ed9eba1;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar16 = (uVar13 ^ uVar8 ^ uVar2 ^ uVar16) << 1 | (uVar13 ^ uVar8 ^ uVar2 ^ uVar16) >> 0x1f;
  uVar19 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar19 + uVar16 + (uVar20 ^ uVar18 ^ uVar21) +
           0x6ed9eba1;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar1 = (uVar14 ^ uVar9 ^ uVar3 ^ uVar1) << 1 | (uVar14 ^ uVar9 ^ uVar3 ^ uVar1) >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar21 + uVar1 + (uVar17 ^ uVar20 ^ uVar18) +
           0x6ed9eba1;
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar2 = (uVar15 ^ uVar10 ^ uVar4 ^ uVar2) << 1 | (uVar15 ^ uVar10 ^ uVar4 ^ uVar2) >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar18 + uVar2 + (uVar19 ^ uVar17 ^ uVar20) +
           0x6ed9eba1;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar3 = (uVar16 ^ uVar11 ^ uVar5 ^ uVar3) << 1 | (uVar16 ^ uVar11 ^ uVar5 ^ uVar3) >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + uVar20 + uVar3 + (uVar21 ^ uVar19 ^ uVar17) +
           0x6ed9eba1;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar4 = (uVar1 ^ uVar12 ^ uVar6 ^ uVar4) << 1 | (uVar1 ^ uVar12 ^ uVar6 ^ uVar4) >> 0x1f;
  uVar17 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar17 + uVar4 + (uVar18 ^ uVar21 ^ uVar19) +
           0x6ed9eba1;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar5 = (uVar2 ^ uVar13 ^ uVar7 ^ uVar5) << 1 | (uVar2 ^ uVar13 ^ uVar7 ^ uVar5) >> 0x1f;
  uVar19 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar19 + uVar5 + (uVar20 ^ uVar18 ^ uVar21) +
           0x6ed9eba1;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar6 = (uVar3 ^ uVar14 ^ uVar8 ^ uVar6) << 1 | (uVar3 ^ uVar14 ^ uVar8 ^ uVar6) >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar21 + uVar6 + (uVar17 ^ uVar20 ^ uVar18) +
           0x6ed9eba1;
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar7 = (uVar4 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar4 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar18 + uVar7 + (uVar19 ^ uVar17 ^ uVar20) +
           0x6ed9eba1;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar8 = (uVar5 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar5 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + uVar20 + uVar8 + (uVar21 ^ uVar19 ^ uVar17) +
           0x6ed9eba1;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar9 = (uVar6 ^ uVar1 ^ uVar11 ^ uVar9) << 1 | (uVar6 ^ uVar1 ^ uVar11 ^ uVar9) >> 0x1f;
  iVar22 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar17 + uVar9 +
           (uVar18 & (uVar21 | uVar19) | uVar21 & uVar19);
  uVar17 = iVar22 + 0x8f1bbcdc;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar10 = (uVar7 ^ uVar2 ^ uVar12 ^ uVar10) << 1 | (uVar7 ^ uVar2 ^ uVar12 ^ uVar10) >> 0x1f;
  iVar23 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar19 + uVar10 +
           (uVar20 & (uVar18 | uVar21) | uVar18 & uVar21);
  uVar19 = iVar23 + 0x8f1bbcdc;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar11 = (uVar8 ^ uVar3 ^ uVar13 ^ uVar11) << 1 | (uVar8 ^ uVar3 ^ uVar13 ^ uVar11) >> 0x1f;
  iVar24 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar21 + uVar11 +
           (uVar17 & (uVar20 | uVar18) | uVar20 & uVar18);
  uVar21 = iVar24 + 0x8f1bbcdc;
  uVar17 = iVar22 * 0x40000000 | uVar17 >> 2;
  uVar12 = (uVar9 ^ uVar4 ^ uVar14 ^ uVar12) << 1 | (uVar9 ^ uVar4 ^ uVar14 ^ uVar12) >> 0x1f;
  iVar22 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar18 + uVar12 +
           (uVar19 & (uVar17 | uVar20) | uVar17 & uVar20);
  uVar18 = iVar22 + 0x8f1bbcdc;
  uVar19 = iVar23 * 0x40000000 | uVar19 >> 2;
  uVar13 = (uVar10 ^ uVar5 ^ uVar15 ^ uVar13) << 1 | (uVar10 ^ uVar5 ^ uVar15 ^ uVar13) >> 0x1f;
  iVar23 = (uVar18 * 0x20 | uVar18 >> 0x1b) + uVar20 + uVar13 +
           (uVar21 & (uVar19 | uVar17) | uVar19 & uVar17);
  uVar20 = iVar23 + 0x8f1bbcdc;
  uVar21 = iVar24 * 0x40000000 | uVar21 >> 2;
  uVar14 = (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) << 1 | (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) >> 0x1f;
  iVar24 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar17 + uVar14 +
           (uVar18 & (uVar21 | uVar19) | uVar21 & uVar19);
  uVar17 = iVar24 + 0x8f1bbcdc;
  uVar18 = iVar22 * 0x40000000 | uVar18 >> 2;
  uVar15 = (uVar12 ^ uVar7 ^ uVar1 ^ uVar15) << 1 | (uVar12 ^ uVar7 ^ uVar1 ^ uVar15) >> 0x1f;
  iVar22 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar19 + uVar15 +
           (uVar20 & (uVar18 | uVar21) | uVar18 & uVar21);
  uVar19 = iVar22 + 0x8f1bbcdc;
  uVar20 = iVar23 * 0x40000000 | uVar20 >> 2;
  uVar16 = (uVar13 ^ uVar8 ^ uVar2 ^ uVar16) << 1 | (uVar13 ^ uVar8 ^ uVar2 ^ uVar16) >> 0x1f;
  iVar23 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar21 + uVar16 +
           (uVar17 & (uVar20 | uVar18) | uVar20 & uVar18);
  uVar21 = iVar23 + 0x8f1bbcdc;
  uVar17 = iVar24 * 0x40000000 | uVar17 >> 2;
  uVar1 = (uVar14 ^ uVar9 ^ uVar3 ^ uVar1) << 1 | (uVar14 ^ uVar9 ^ uVar3 ^ uVar1) >> 0x1f;
  iVar24 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar18 + uVar1 +
           (uVar19 & (uVar17 | uVar20) | uVar17 & uVar20);
  uVar18 = iVar24 + 0x8f1bbcdc;
  uVar19 = iVar22 * 0x40000000 | uVar19 >> 2;
  uVar2 = (uVar15 ^ uVar10 ^ uVar4 ^ uVar2) << 1 | (uVar15 ^ uVar10 ^ uVar4 ^ uVar2) >> 0x1f;
  iVar22 = (uVar18 * 0x20 | uVar18 >> 0x1b) + uVar20 + uVar2 +
           (uVar21 & (uVar19 | uVar17) | uVar19 & uVar17);
  uVar20 = iVar22 + 0x8f1bbcdc;
  uVar21 = iVar23 * 0x40000000 | uVar21 >> 2;
  uVar3 = (uVar16 ^ uVar11 ^ uVar5 ^ uVar3) << 1 | (uVar16 ^ uVar11 ^ uVar5 ^ uVar3) >> 0x1f;
  iVar23 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar17 + uVar3 +
           (uVar18 & (uVar21 | uVar19) | uVar21 & uVar19);
  uVar17 = iVar23 + 0x8f1bbcdc;
  uVar18 = iVar24 * 0x40000000 | uVar18 >> 2;
  uVar4 = (uVar1 ^ uVar12 ^ uVar6 ^ uVar4) << 1 | (uVar1 ^ uVar12 ^ uVar6 ^ uVar4) >> 0x1f;
  iVar24 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar19 + uVar4 +
           (uVar20 & (uVar18 | uVar21) | uVar18 & uVar21);
  uVar19 = iVar24 + 0x8f1bbcdc;
  uVar20 = iVar22 * 0x40000000 | uVar20 >> 2;
  uVar5 = (uVar2 ^ uVar13 ^ uVar7 ^ uVar5) << 1 | (uVar2 ^ uVar13 ^ uVar7 ^ uVar5) >> 0x1f;
  iVar22 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar21 + uVar5 +
           (uVar17 & (uVar20 | uVar18) | uVar20 & uVar18);
  uVar21 = iVar22 + 0x8f1bbcdc;
  uVar17 = iVar23 * 0x40000000 | uVar17 >> 2;
  uVar6 = (uVar3 ^ uVar14 ^ uVar8 ^ uVar6) << 1 | (uVar3 ^ uVar14 ^ uVar8 ^ uVar6) >> 0x1f;
  iVar23 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar18 + uVar6 +
           (uVar19 & (uVar17 | uVar20) | uVar17 & uVar20);
  uVar18 = iVar23 + 0x8f1bbcdc;
  uVar19 = iVar24 * 0x40000000 | uVar19 >> 2;
  uVar7 = (uVar4 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar4 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
  iVar24 = (uVar18 * 0x20 | uVar18 >> 0x1b) + uVar20 + uVar7 +
           (uVar21 & (uVar19 | uVar17) | uVar19 & uVar17);
  uVar20 = iVar24 + 0x8f1bbcdc;
  uVar21 = iVar22 * 0x40000000 | uVar21 >> 2;
  uVar8 = (uVar5 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar5 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
  iVar22 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar17 + uVar8 +
           (uVar18 & (uVar21 | uVar19) | uVar21 & uVar19);
  uVar17 = iVar22 + 0x8f1bbcdc;
  uVar18 = iVar23 * 0x40000000 | uVar18 >> 2;
  uVar9 = (uVar6 ^ uVar1 ^ uVar11 ^ uVar9) << 1 | (uVar6 ^ uVar1 ^ uVar11 ^ uVar9) >> 0x1f;
  iVar23 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar19 + uVar9 +
           (uVar20 & (uVar18 | uVar21) | uVar18 & uVar21);
  uVar19 = iVar23 + 0x8f1bbcdc;
  uVar20 = iVar24 * 0x40000000 | uVar20 >> 2;
  uVar10 = (uVar7 ^ uVar2 ^ uVar12 ^ uVar10) << 1 | (uVar7 ^ uVar2 ^ uVar12 ^ uVar10) >> 0x1f;
  iVar24 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar21 + uVar10 +
           (uVar17 & (uVar20 | uVar18) | uVar20 & uVar18);
  uVar21 = iVar24 + 0x8f1bbcdc;
  uVar17 = iVar22 * 0x40000000 | uVar17 >> 2;
  uVar11 = (uVar8 ^ uVar3 ^ uVar13 ^ uVar11) << 1 | (uVar8 ^ uVar3 ^ uVar13 ^ uVar11) >> 0x1f;
  iVar22 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar18 + uVar11 +
           (uVar19 & (uVar17 | uVar20) | uVar17 & uVar20);
  uVar18 = iVar22 + 0x8f1bbcdc;
  uVar19 = iVar23 * 0x40000000 | uVar19 >> 2;
  uVar12 = (uVar9 ^ uVar4 ^ uVar14 ^ uVar12) << 1 | (uVar9 ^ uVar4 ^ uVar14 ^ uVar12) >> 0x1f;
  iVar23 = (uVar18 * 0x20 | uVar18 >> 0x1b) + uVar20 + uVar12 +
           (uVar21 & (uVar19 | uVar17) | uVar19 & uVar17);
  uVar20 = iVar23 + 0x8f1bbcdc;
  uVar21 = iVar24 * 0x40000000 | uVar21 >> 2;
  uVar13 = (uVar10 ^ uVar5 ^ uVar15 ^ uVar13) << 1 | (uVar10 ^ uVar5 ^ uVar15 ^ uVar13) >> 0x1f;
  uVar17 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar17 + uVar13 + (uVar18 ^ uVar21 ^ uVar19) +
           0xca62c1d6;
  uVar18 = iVar22 * 0x40000000 | uVar18 >> 2;
  uVar14 = (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) << 1 | (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) >> 0x1f;
  uVar19 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar19 + uVar14 + (uVar20 ^ uVar18 ^ uVar21) +
           0xca62c1d6;
  uVar20 = iVar23 * 0x40000000 | uVar20 >> 2;
  uVar15 = (uVar12 ^ uVar7 ^ uVar1 ^ uVar15) << 1 | (uVar12 ^ uVar7 ^ uVar1 ^ uVar15) >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar21 + uVar15 + (uVar17 ^ uVar20 ^ uVar18) +
           0xca62c1d6;
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar16 = (uVar13 ^ uVar8 ^ uVar2 ^ uVar16) << 1 | (uVar13 ^ uVar8 ^ uVar2 ^ uVar16) >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar18 + uVar16 + (uVar19 ^ uVar17 ^ uVar20) +
           0xca62c1d6;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar1 = (uVar14 ^ uVar9 ^ uVar3 ^ uVar1) << 1 | (uVar14 ^ uVar9 ^ uVar3 ^ uVar1) >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + uVar20 + uVar1 + (uVar21 ^ uVar19 ^ uVar17) +
           0xca62c1d6;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar2 = (uVar15 ^ uVar10 ^ uVar4 ^ uVar2) << 1 | (uVar15 ^ uVar10 ^ uVar4 ^ uVar2) >> 0x1f;
  uVar17 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar17 + uVar2 + (uVar18 ^ uVar21 ^ uVar19) +
           0xca62c1d6;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar3 = (uVar16 ^ uVar11 ^ uVar5 ^ uVar3) << 1 | (uVar16 ^ uVar11 ^ uVar5 ^ uVar3) >> 0x1f;
  uVar19 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar19 + uVar3 + (uVar20 ^ uVar18 ^ uVar21) +
           0xca62c1d6;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar4 = (uVar1 ^ uVar12 ^ uVar6 ^ uVar4) << 1 | (uVar1 ^ uVar12 ^ uVar6 ^ uVar4) >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar21 + uVar4 + (uVar17 ^ uVar20 ^ uVar18) +
           0xca62c1d6;
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar5 = (uVar2 ^ uVar13 ^ uVar7 ^ uVar5) << 1 | (uVar2 ^ uVar13 ^ uVar7 ^ uVar5) >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar18 + uVar5 + (uVar19 ^ uVar17 ^ uVar20) +
           0xca62c1d6;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar6 = (uVar3 ^ uVar14 ^ uVar8 ^ uVar6) << 1 | (uVar3 ^ uVar14 ^ uVar8 ^ uVar6) >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + uVar20 + uVar6 + (uVar21 ^ uVar19 ^ uVar17) +
           0xca62c1d6;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar7 = (uVar4 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar4 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
  uVar17 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar17 + uVar7 + (uVar18 ^ uVar21 ^ uVar19) +
           0xca62c1d6;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar8 = (uVar5 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar5 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
  uVar19 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar19 + uVar8 + (uVar20 ^ uVar18 ^ uVar21) +
           0xca62c1d6;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar9 = (uVar6 ^ uVar1 ^ uVar11 ^ uVar9) << 1 | (uVar6 ^ uVar1 ^ uVar11 ^ uVar9) >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar21 + uVar9 + (uVar17 ^ uVar20 ^ uVar18) +
           0xca62c1d6;
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar10 = (uVar7 ^ uVar2 ^ uVar12 ^ uVar10) << 1 | (uVar7 ^ uVar2 ^ uVar12 ^ uVar10) >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar18 + uVar10 + (uVar19 ^ uVar17 ^ uVar20) +
           0xca62c1d6;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar3 = (uVar8 ^ uVar3 ^ uVar13 ^ uVar11) << 1 | (uVar8 ^ uVar3 ^ uVar13 ^ uVar11) >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + uVar20 + uVar3 + (uVar21 ^ uVar19 ^ uVar17) +
           0xca62c1d6;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar4 = (uVar9 ^ uVar4 ^ uVar14 ^ uVar12) << 1 | (uVar9 ^ uVar4 ^ uVar14 ^ uVar12) >> 0x1f;
  uVar9 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar17 + uVar4 + (uVar18 ^ uVar21 ^ uVar19) +
          0xca62c1d6;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar5 = (uVar10 ^ uVar5 ^ uVar15 ^ uVar13) << 1 | (uVar10 ^ uVar5 ^ uVar15 ^ uVar13) >> 0x1f;
  uVar10 = (uVar9 * 0x20 | uVar9 >> 0x1b) + uVar19 + uVar5 + (uVar20 ^ uVar18 ^ uVar21) + 0xca62c1d6
  ;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar21 = (uVar10 * 0x20 | uVar10 >> 0x1b) + uVar21 +
           ((uVar3 ^ uVar6 ^ uVar16 ^ uVar14) << 1 | (uVar3 ^ uVar6 ^ uVar16 ^ uVar14) >> 0x1f) +
           (uVar9 ^ uVar20 ^ uVar18) + 0xca62c1d6;
  uVar3 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar18 +
           ((uVar4 ^ uVar7 ^ uVar1 ^ uVar15) << 1 | (uVar4 ^ uVar7 ^ uVar1 ^ uVar15) >> 0x1f) +
           (uVar10 ^ uVar3 ^ uVar20) + 0xca62c1d6;
  uVar1 = uVar10 * 0x40000000 | uVar10 >> 2;
  (s->digest).i[4] = uVar3 + (s->digest).i[4];
  (s->digest).i[3] = uVar1 + (s->digest).i[3];
  (s->digest).i[2] = (uVar21 * 0x40000000 | uVar21 >> 2) + (s->digest).i[2];
  (s->digest).i[1] = uVar18 + (s->digest).i[1];
  (s->digest).i[0] =
       (uVar18 * 0x20 | uVar18 >> 0x1b) + uVar20 +
       ((uVar5 ^ uVar8 ^ uVar2 ^ uVar16) << 1 | (uVar5 ^ uVar8 ^ uVar2 ^ uVar16) >> 0x1f) +
       (uVar21 ^ uVar1 ^ uVar3) + -0x359d3e2a + (s->digest).i[0];
  return;
}

Assistant:

static inline void fio_sha1_perform_all_rounds(fio_sha1_s *s,
                                               const uint8_t *buffer) {
  /* collect data */
  uint32_t a = s->digest.i[0];
  uint32_t b = s->digest.i[1];
  uint32_t c = s->digest.i[2];
  uint32_t d = s->digest.i[3];
  uint32_t e = s->digest.i[4];
  uint32_t t, w[16];
  /* copy data to words, performing byte swapping as needed */
  w[0] = fio_str2u32(buffer);
  w[1] = fio_str2u32(buffer + 4);
  w[2] = fio_str2u32(buffer + 8);
  w[3] = fio_str2u32(buffer + 12);
  w[4] = fio_str2u32(buffer + 16);
  w[5] = fio_str2u32(buffer + 20);
  w[6] = fio_str2u32(buffer + 24);
  w[7] = fio_str2u32(buffer + 28);
  w[8] = fio_str2u32(buffer + 32);
  w[9] = fio_str2u32(buffer + 36);
  w[10] = fio_str2u32(buffer + 40);
  w[11] = fio_str2u32(buffer + 44);
  w[12] = fio_str2u32(buffer + 48);
  w[13] = fio_str2u32(buffer + 52);
  w[14] = fio_str2u32(buffer + 56);
  w[15] = fio_str2u32(buffer + 60);
  /* perform rounds */
#undef perform_single_round
#define perform_single_round(num)                                              \
  t = fio_lrot32(a, 5) + e + w[num] + ((b & c) | ((~b) & d)) + 0x5A827999;     \
  e = d;                                                                       \
  d = c;                                                                       \
  c = fio_lrot32(b, 30);                                                       \
  b = a;                                                                       \
  a = t;

#define perform_four_rounds(i)                                                 \
  perform_single_round(i);                                                     \
  perform_single_round(i + 1);                                                 \
  perform_single_round(i + 2);                                                 \
  perform_single_round(i + 3);

  perform_four_rounds(0);
  perform_four_rounds(4);
  perform_four_rounds(8);
  perform_four_rounds(12);

#undef perform_single_round
#define perform_single_round(i)                                                \
  w[(i)&15] = fio_lrot32((w[(i - 3) & 15] ^ w[(i - 8) & 15] ^                  \
                          w[(i - 14) & 15] ^ w[(i - 16) & 15]),                \
                         1);                                                   \
  t = fio_lrot32(a, 5) + e + w[(i)&15] + ((b & c) | ((~b) & d)) + 0x5A827999;  \
  e = d;                                                                       \
  d = c;                                                                       \
  c = fio_lrot32(b, 30);                                                       \
  b = a;                                                                       \
  a = t;

  perform_four_rounds(16);

#undef perform_single_round
#define perform_single_round(i)                                                \
  w[(i)&15] = fio_lrot32((w[(i - 3) & 15] ^ w[(i - 8) & 15] ^                  \
                          w[(i - 14) & 15] ^ w[(i - 16) & 15]),                \
                         1);                                                   \
  t = fio_lrot32(a, 5) + e + w[(i)&15] + (b ^ c ^ d) + 0x6ED9EBA1;             \
  e = d;                                                                       \
  d = c;                                                                       \
  c = fio_lrot32(b, 30);                                                       \
  b = a;                                                                       \
  a = t;

  perform_four_rounds(20);
  perform_four_rounds(24);
  perform_four_rounds(28);
  perform_four_rounds(32);
  perform_four_rounds(36);

#undef perform_single_round
#define perform_single_round(i)                                                \
  w[(i)&15] = fio_lrot32((w[(i - 3) & 15] ^ w[(i - 8) & 15] ^                  \
                          w[(i - 14) & 15] ^ w[(i - 16) & 15]),                \
                         1);                                                   \
  t = fio_lrot32(a, 5) + e + w[(i)&15] + ((b & (c | d)) | (c & d)) +           \
      0x8F1BBCDC;                                                              \
  e = d;                                                                       \
  d = c;                                                                       \
  c = fio_lrot32(b, 30);                                                       \
  b = a;                                                                       \
  a = t;

  perform_four_rounds(40);
  perform_four_rounds(44);
  perform_four_rounds(48);
  perform_four_rounds(52);
  perform_four_rounds(56);
#undef perform_single_round
#define perform_single_round(i)                                                \
  w[(i)&15] = fio_lrot32((w[(i - 3) & 15] ^ w[(i - 8) & 15] ^                  \
                          w[(i - 14) & 15] ^ w[(i - 16) & 15]),                \
                         1);                                                   \
  t = fio_lrot32(a, 5) + e + w[(i)&15] + (b ^ c ^ d) + 0xCA62C1D6;             \
  e = d;                                                                       \
  d = c;                                                                       \
  c = fio_lrot32(b, 30);                                                       \
  b = a;                                                                       \
  a = t;
  perform_four_rounds(60);
  perform_four_rounds(64);
  perform_four_rounds(68);
  perform_four_rounds(72);
  perform_four_rounds(76);

  /* store data */
  s->digest.i[4] += e;
  s->digest.i[3] += d;
  s->digest.i[2] += c;
  s->digest.i[1] += b;
  s->digest.i[0] += a;
}